

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O2

void __thiscall QPDFObjectHandle::insertItem(QPDFObjectHandle *this,int at,QPDFObjectHandle *item)

{
  bool bVar1;
  Array array;
  allocator<char> local_59;
  string local_58;
  Array local_38;
  
  as_array(&local_38,this,strict);
  if (local_38.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"ignoring attempt to insert item",&local_59);
    typeWarning(this,"array",&local_58);
  }
  else {
    bVar1 = ::qpdf::Array::insert(&local_38,at,item);
    if (bVar1) goto LAB_001c12f2;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"ignoring attempt to insert out of bounds array item",&local_59);
    objectWarning(this,&local_58);
  }
  std::__cxx11::string::~string((string *)&local_58);
LAB_001c12f2:
  ::qpdf::Array::~Array(&local_38);
  return;
}

Assistant:

void
QPDFObjectHandle::insertItem(int at, QPDFObjectHandle const& item)
{
    if (auto array = as_array(strict)) {
        if (!array.insert(at, item)) {
            objectWarning("ignoring attempt to insert out of bounds array item");
            QTC::TC("qpdf", "QPDFObjectHandle insert array bounds");
        }
    } else {
        typeWarning("array", "ignoring attempt to insert item");
        QTC::TC("qpdf", "QPDFObjectHandle array ignoring insert item");
    }
}